

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s256_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 *in_RDX;
  ulong *in_RDI;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t bit;
  undefined8 uVar9;
  word idx_00;
  undefined8 uVar10;
  uint i;
  word idx;
  uint w;
  word256 cval [2];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  size_t bit_00;
  word idx_01;
  int local_3d4;
  int local_3c4;
  ulong local_3c0;
  ulong uStack_3b8;
  ulong uStack_3b0;
  ulong uStack_3a8;
  ulong local_3a0;
  ulong uStack_398;
  ulong uStack_390;
  ulong uStack_388;
  undefined8 *local_370;
  ulong local_2c0;
  ulong uStack_2b8;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  ulong local_1c0;
  ulong uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  ulong local_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  
  local_3c0 = 0;
  uStack_3b8 = 0;
  uStack_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 0;
  uStack_398 = 0;
  uStack_390 = 0;
  uStack_388 = 0;
  local_370 = in_RDX;
  for (local_3c4 = 2; local_3c4 != 0; local_3c4 = local_3c4 + -1) {
    for (local_3d4 = 0x40; local_3d4 != 0; local_3d4 = local_3d4 + -8) {
      uVar8 = *local_370;
      bit = local_370[1];
      idx_00 = local_370[2];
      uVar9 = local_370[3];
      uVar7 = uVar8;
      uVar10 = uVar9;
      bit_00 = bit;
      idx_01 = idx_00;
      mm256_compute_mask_2(idx_00,bit);
      auVar6._8_8_ = bit_00;
      auVar6._0_8_ = uVar8;
      auVar6._16_8_ = idx_01;
      auVar6._24_8_ = uVar9;
      auVar5._8_8_ = bit;
      auVar5._0_8_ = uVar7;
      auVar5._16_8_ = idx_00;
      auVar5._24_8_ = uVar10;
      auVar1 = vpand_avx2(auVar6,auVar5);
      local_180 = auVar1._0_8_;
      uStack_178 = auVar1._8_8_;
      uStack_170 = auVar1._16_8_;
      uStack_168 = auVar1._24_8_;
      uVar8 = *(undefined8 *)*(undefined1 (*) [32])(local_370 + 4);
      uVar9 = local_370[5];
      uVar7 = local_370[6];
      uVar10 = local_370[7];
      auVar1 = *(undefined1 (*) [32])(local_370 + 4);
      mm256_compute_mask_2(idx_01,bit_00);
      auVar4._8_8_ = uVar9;
      auVar4._0_8_ = uVar8;
      auVar4._16_8_ = uVar7;
      auVar4._24_8_ = uVar10;
      auVar1 = vpand_avx2(auVar1,auVar4);
      local_1c0 = auVar1._0_8_;
      uStack_1b8 = auVar1._8_8_;
      uStack_1b0 = auVar1._16_8_;
      uStack_1a8 = auVar1._24_8_;
      uVar8 = *(undefined8 *)*(undefined1 (*) [32])(local_370 + 8);
      uVar9 = local_370[9];
      uVar7 = local_370[10];
      uVar10 = local_370[0xb];
      auVar1 = *(undefined1 (*) [32])(local_370 + 8);
      mm256_compute_mask_2(idx_01,bit_00);
      auVar3._8_8_ = uVar9;
      auVar3._0_8_ = uVar8;
      auVar3._16_8_ = uVar7;
      auVar3._24_8_ = uVar10;
      auVar1 = vpand_avx2(auVar1,auVar3);
      local_200 = auVar1._0_8_;
      uStack_1f8 = auVar1._8_8_;
      uStack_1f0 = auVar1._16_8_;
      uStack_1e8 = auVar1._24_8_;
      local_3c0 = local_3c0 ^ local_180 ^ local_200;
      uStack_3b8 = uStack_3b8 ^ uStack_178 ^ uStack_1f8;
      uStack_3b0 = uStack_3b0 ^ uStack_170 ^ uStack_1f0;
      uStack_3a8 = uStack_3a8 ^ uStack_168 ^ uStack_1e8;
      uVar8 = *(undefined8 *)*(undefined1 (*) [32])(local_370 + 0xc);
      uVar9 = local_370[0xd];
      uVar7 = local_370[0xe];
      uVar10 = local_370[0xf];
      auVar1 = *(undefined1 (*) [32])(local_370 + 0xc);
      mm256_compute_mask_2(idx_01,bit_00);
      auVar2._8_8_ = uVar9;
      auVar2._0_8_ = uVar8;
      auVar2._16_8_ = uVar7;
      auVar2._24_8_ = uVar10;
      auVar1 = vpand_avx2(auVar1,auVar2);
      local_240 = auVar1._0_8_;
      uStack_238 = auVar1._8_8_;
      uStack_230 = auVar1._16_8_;
      uStack_228 = auVar1._24_8_;
      local_3a0 = local_3a0 ^ local_1c0 ^ local_240;
      uStack_398 = uStack_398 ^ uStack_1b8 ^ uStack_238;
      uStack_390 = uStack_390 ^ uStack_1b0 ^ uStack_230;
      uStack_388 = uStack_388 ^ uStack_1a8 ^ uStack_228;
      local_370 = local_370 + 0x10;
    }
  }
  auVar1._8_8_ = uStack_3b8 ^ uStack_398;
  auVar1._0_8_ = local_3c0 ^ local_3a0;
  auVar1._16_8_ = uStack_3b0 ^ uStack_390;
  auVar1._24_8_ = uStack_3a8 ^ uStack_388;
  auVar1 = vpermq_avx2(auVar1,0xee);
  local_2c0 = auVar1._0_8_;
  uStack_2b8 = auVar1._8_8_;
  *in_RDI = local_3c0 ^ local_3a0 ^ local_2c0;
  in_RDI[1] = uStack_3b8 ^ uStack_398 ^ uStack_2b8;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_zero, mm256_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 8, idx >>= 8, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
    }
  }
  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(
      cblock->w64,
      _mm256_extracti128_si256(
          mm256_xor(cval[0], _mm256_permute4x64_epi64(cval[0], _MM_SHUFFLE(3, 2, 3, 2))), 0));
}